

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O0

size_t BUFFER_length(BUFFER_HANDLE handle)

{
  BUFFER *b;
  size_t result;
  BUFFER_HANDLE handle_local;
  
  if (handle == (BUFFER_HANDLE)0x0) {
    b = (BUFFER *)0x0;
  }
  else {
    b = (BUFFER *)handle->size;
  }
  return (size_t)b;
}

Assistant:

size_t BUFFER_length(BUFFER_HANDLE handle)
{
    size_t result;
    if (handle == NULL)
    {
        /* Codes_SRS_BUFFER_07_028: [BUFFER_length shall return zero for any error that is encountered.] */
        result = 0;
    }
    else
    {
        BUFFER* b = (BUFFER*)handle;
        result = b->size;
    }
    return result;
}